

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sisd_alignment_engine.cpp
# Opt level: O1

void __thiscall
spoa::SisdAlignmentEngine::Initialize
          (SisdAlignmentEngine *this,char *sequence,uint32_t sequence_len,Graph *graph)

{
  ulong uVar1;
  char cVar2;
  AlignmentSubtype AVar3;
  AlignmentType AVar4;
  pointer puVar5;
  pointer puVar6;
  pointer piVar7;
  pointer ppNVar8;
  long lVar9;
  Implementation *pIVar10;
  int32_t *piVar11;
  int32_t *piVar12;
  pointer ppEVar13;
  int32_t *piVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  const_iterator __begin4;
  pointer ppEVar21;
  const_iterator __end4;
  ulong uVar22;
  ulong uVar23;
  const_iterator __begin3;
  const_iterator __end3;
  int iVar24;
  
  uVar20 = sequence_len + 1;
  puVar5 = (graph->nodes_).
           super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar6 = (graph->nodes_).
           super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (graph->num_codes_ != 0) {
    piVar7 = (graph->decoder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar19 = *(long *)&(((this->pimpl_)._M_t.
                         super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                         .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                        _M_head_impl)->sequence_profile).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl;
    iVar17 = 1;
    uVar22 = 0;
    do {
      iVar24 = piVar7[uVar22 & 0xff];
      *(undefined4 *)(lVar19 + (ulong)(uVar20 * (int)uVar22) * 4) = 0;
      if (sequence_len != 0) {
        uVar23 = 0;
        do {
          uVar1 = uVar23 + 1;
          *(int *)(lVar19 + (ulong)(uint)((int)uVar23 + iVar17) * 4) =
               (int)*(char *)((long)&(this->super_AlignmentEngine)._vptr_AlignmentEngine +
                             ((ulong)(sequence[uVar23] == (char)iVar24) ^ 0x11));
          uVar23 = uVar1;
        } while (sequence_len != uVar1);
      }
      uVar22 = uVar22 + 1;
      iVar17 = iVar17 + uVar20;
    } while (uVar22 < graph->num_codes_);
  }
  ppNVar8 = (graph->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar19 = (long)(graph->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar8;
  if (lVar19 != 0) {
    lVar9 = *(long *)&(((this->pimpl_)._M_t.
                        super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                        .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                       _M_head_impl)->node_id_to_rank).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    uVar22 = 0;
    do {
      *(int *)(lVar9 + (ulong)ppNVar8[uVar22]->id * 4) = (int)uVar22;
      uVar22 = uVar22 + 1;
    } while ((uVar22 & 0xffffffff) < (ulong)(lVar19 >> 3));
  }
  uVar16 = (int)((ulong)((long)puVar5 - (long)puVar6) >> 3) + 1;
  uVar22 = (ulong)uVar16;
  AVar3 = (this->super_AlignmentEngine).subtype_;
  if (AVar3 != kLinear) {
    if (AVar3 != kAffine) {
      if (AVar3 != kConvex) goto LAB_00120b5b;
      pIVar10 = (this->pimpl_)._M_t.
                super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                ._M_t.
                super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                _M_head_impl;
      piVar11 = pIVar10->O;
      *piVar11 = 0;
      piVar12 = pIVar10->Q;
      *piVar12 = 0;
      if (1 < uVar20) {
        iVar17 = (int)(this->super_AlignmentEngine).q_;
        cVar2 = (this->super_AlignmentEngine).c_;
        uVar23 = 1;
        do {
          piVar11[uVar23] = -0x7ffffc00;
          piVar12[uVar23] = iVar17;
          uVar23 = uVar23 + 1;
          iVar17 = iVar17 + cVar2;
        } while (uVar20 != uVar23);
      }
      if (1 < uVar16) {
        uVar23 = 1;
        do {
          ppEVar21 = (ppNVar8[uVar23 - 1]->inedges).
                     super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppEVar13 = *(pointer *)
                      ((long)&(ppNVar8[uVar23 - 1]->inedges).
                              super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                              ._M_impl + 8);
          iVar24 = (int)(this->super_AlignmentEngine).c_;
          iVar17 = (this->super_AlignmentEngine).q_ - iVar24;
          if (ppEVar21 != ppEVar13) {
            iVar17 = -0x7ffffc00;
            do {
              iVar15 = piVar11[(*(int *)(*(long *)&(pIVar10->node_id_to_rank).
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        + (ulong)(*ppEVar21)->tail->id * 4) + 1) * uVar20];
              if (piVar11[(*(int *)(*(long *)&(pIVar10->node_id_to_rank).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                   + (ulong)(*ppEVar21)->tail->id * 4) + 1) * uVar20] < iVar17) {
                iVar15 = iVar17;
              }
              iVar17 = iVar15;
              ppEVar21 = ppEVar21 + 1;
            } while (ppEVar21 != ppEVar13);
          }
          uVar18 = uVar20 * (int)uVar23;
          piVar11[uVar18] = iVar17 + iVar24;
          piVar12[uVar18] = -0x7ffffc00;
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar16);
      }
    }
    pIVar10 = (this->pimpl_)._M_t.
              super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              ._M_t.
              super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
              _M_head_impl;
    piVar11 = pIVar10->F;
    *piVar11 = 0;
    piVar12 = pIVar10->E;
    *piVar12 = 0;
    if (1 < uVar20) {
      iVar17 = (int)(this->super_AlignmentEngine).g_;
      cVar2 = (this->super_AlignmentEngine).e_;
      uVar23 = 1;
      do {
        piVar11[uVar23] = -0x7ffffc00;
        piVar12[uVar23] = iVar17;
        uVar23 = uVar23 + 1;
        iVar17 = iVar17 + cVar2;
      } while (uVar20 != uVar23);
    }
    if (1 < uVar16) {
      uVar23 = 1;
      do {
        ppEVar21 = (ppNVar8[uVar23 - 1]->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar13 = *(pointer *)
                    ((long)&(ppNVar8[uVar23 - 1]->inedges).
                            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                            ._M_impl + 8);
        iVar24 = (int)(this->super_AlignmentEngine).e_;
        iVar17 = (this->super_AlignmentEngine).g_ - iVar24;
        if (ppEVar21 != ppEVar13) {
          iVar17 = -0x7ffffc00;
          do {
            iVar15 = piVar11[(*(int *)(*(long *)&(pIVar10->node_id_to_rank).
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      + (ulong)(*ppEVar21)->tail->id * 4) + 1) * uVar20];
            if (piVar11[(*(int *)(*(long *)&(pIVar10->node_id_to_rank).
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                 + (ulong)(*ppEVar21)->tail->id * 4) + 1) * uVar20] < iVar17) {
              iVar15 = iVar17;
            }
            iVar17 = iVar15;
            ppEVar21 = ppEVar21 + 1;
          } while (ppEVar21 != ppEVar13);
        }
        uVar18 = uVar20 * (int)uVar23;
        piVar11[uVar18] = iVar17 + iVar24;
        piVar12[uVar18] = -0x7ffffc00;
        uVar23 = uVar23 + 1;
      } while (uVar23 != uVar22);
    }
  }
  *((this->pimpl_)._M_t.
    super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
    ._M_t.
    super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
    .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl)->H = 0;
LAB_00120b5b:
  AVar4 = (this->super_AlignmentEngine).type_;
  if (AVar4 == kOV) {
    if (AVar3 == kConvex) {
      if (1 < uVar20) {
        pIVar10 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                  _M_head_impl;
        piVar11 = pIVar10->Q;
        piVar12 = pIVar10->H;
        piVar14 = pIVar10->E;
        uVar23 = 1;
        do {
          iVar17 = piVar14[uVar23];
          if (piVar14[uVar23] < piVar11[uVar23]) {
            iVar17 = piVar11[uVar23];
          }
          piVar12[uVar23] = iVar17;
          uVar23 = uVar23 + 1;
        } while (uVar20 != uVar23);
      }
    }
    else if (AVar3 == kAffine) {
      if (1 < uVar20) {
        pIVar10 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                  _M_head_impl;
        piVar11 = pIVar10->H;
        piVar12 = pIVar10->E;
        uVar23 = 1;
        do {
          piVar11[uVar23] = piVar12[uVar23];
          uVar23 = uVar23 + 1;
        } while (uVar20 != uVar23);
      }
    }
    else if ((AVar3 == kLinear) && (1 < uVar20)) {
      iVar24 = (int)(this->super_AlignmentEngine).g_;
      piVar11 = ((this->pimpl_)._M_t.
                 super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                 .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                _M_head_impl)->H;
      uVar23 = 1;
      iVar17 = iVar24;
      do {
        piVar11[uVar23] = iVar17;
        uVar23 = uVar23 + 1;
        iVar17 = iVar17 + iVar24;
      } while (uVar20 != uVar23);
    }
    if (1 < uVar16) {
      piVar11 = ((this->pimpl_)._M_t.
                 super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                 .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                _M_head_impl)->H;
      lVar19 = uVar22 - 1;
      uVar16 = uVar20;
      do {
        piVar11[uVar16] = 0;
        uVar16 = uVar16 + uVar20;
        lVar19 = lVar19 + -1;
      } while (lVar19 != 0);
    }
  }
  else if (AVar4 == kNW) {
    if (AVar3 == kConvex) {
      if (1 < uVar20) {
        pIVar10 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                  _M_head_impl;
        piVar11 = pIVar10->Q;
        piVar12 = pIVar10->H;
        piVar14 = pIVar10->E;
        uVar23 = 1;
        do {
          iVar17 = piVar14[uVar23];
          if (piVar14[uVar23] < piVar11[uVar23]) {
            iVar17 = piVar11[uVar23];
          }
          piVar12[uVar23] = iVar17;
          uVar23 = uVar23 + 1;
        } while (uVar20 != uVar23);
      }
      if (1 < uVar16) {
        pIVar10 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                  _M_head_impl;
        piVar11 = pIVar10->O;
        piVar12 = pIVar10->H;
        piVar14 = pIVar10->F;
        lVar19 = uVar22 - 1;
        uVar16 = uVar20;
        do {
          iVar17 = piVar14[uVar16];
          if (piVar14[uVar16] < piVar11[uVar16]) {
            iVar17 = piVar11[uVar16];
          }
          piVar12[uVar16] = iVar17;
          uVar16 = uVar16 + uVar20;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
      }
    }
    else if (AVar3 == kAffine) {
      if (1 < uVar20) {
        pIVar10 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                  _M_head_impl;
        piVar11 = pIVar10->H;
        piVar12 = pIVar10->E;
        uVar23 = 1;
        do {
          piVar11[uVar23] = piVar12[uVar23];
          uVar23 = uVar23 + 1;
        } while (uVar20 != uVar23);
      }
      if (1 < uVar16) {
        pIVar10 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                  _M_head_impl;
        piVar11 = pIVar10->H;
        piVar12 = pIVar10->F;
        lVar19 = uVar22 - 1;
        uVar16 = uVar20;
        do {
          piVar11[uVar16] = piVar12[uVar16];
          uVar16 = uVar16 + uVar20;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
      }
    }
    else if (AVar3 == kLinear) {
      if (1 < uVar20) {
        iVar24 = (int)(this->super_AlignmentEngine).g_;
        piVar11 = ((this->pimpl_)._M_t.
                   super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                   .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                  _M_head_impl)->H;
        uVar23 = 1;
        iVar17 = iVar24;
        do {
          piVar11[uVar23] = iVar17;
          uVar23 = uVar23 + 1;
          iVar17 = iVar17 + iVar24;
        } while (uVar20 != uVar23);
      }
      if (1 < uVar16) {
        pIVar10 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                  _M_head_impl;
        cVar2 = (this->super_AlignmentEngine).g_;
        piVar11 = pIVar10->H;
        uVar23 = 1;
        do {
          ppEVar21 = (ppNVar8[uVar23 - 1]->inedges).
                     super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppEVar13 = *(pointer *)
                      ((long)&(ppNVar8[uVar23 - 1]->inedges).
                              super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                              ._M_impl + 8);
          iVar17 = -0x7ffffc00;
          if (ppEVar21 == ppEVar13) {
            iVar17 = 0;
          }
          else {
            do {
              iVar24 = pIVar10->H
                       [(*(int *)(*(long *)&(pIVar10->node_id_to_rank).
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                 + (ulong)(*ppEVar21)->tail->id * 4) + 1) * uVar20];
              if (pIVar10->H
                  [(*(int *)(*(long *)&(pIVar10->node_id_to_rank).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            + (ulong)(*ppEVar21)->tail->id * 4) + 1) * uVar20] < iVar17) {
                iVar24 = iVar17;
              }
              iVar17 = iVar24;
              ppEVar21 = ppEVar21 + 1;
            } while (ppEVar21 != ppEVar13);
          }
          piVar11[uVar20 * (int)uVar23] = iVar17 + cVar2;
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar22);
      }
    }
  }
  else if (AVar4 == kSW) {
    if (1 < uVar20) {
      memset(((this->pimpl_)._M_t.
              super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              ._M_t.
              super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
             _M_head_impl)->H + 1,0,(ulong)sequence_len << 2);
    }
    if (1 < uVar16) {
      piVar11 = ((this->pimpl_)._M_t.
                 super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                 .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                _M_head_impl)->H;
      lVar19 = uVar22 - 1;
      uVar16 = uVar20;
      do {
        piVar11[uVar16] = 0;
        uVar16 = uVar16 + uVar20;
        lVar19 = lVar19 + -1;
      } while (lVar19 != 0);
    }
  }
  return;
}

Assistant:

void SisdAlignmentEngine::Initialize(
    const char* sequence, std::uint32_t sequence_len,
    const Graph& graph) noexcept {
  std::uint32_t matrix_width = sequence_len + 1;
  std::uint32_t matrix_height = graph.nodes().size() + 1;

  for (std::uint32_t i = 0; i < graph.num_codes(); ++i) {
    char c = graph.decoder(i);
    pimpl_->sequence_profile[i * matrix_width] = 0;
    for (std::uint32_t j = 0; j < sequence_len; ++j) {
      pimpl_->sequence_profile[i * matrix_width + (j + 1)] =
          (c == sequence[j] ? m_ : n_);
    }
  }

  const auto& rank_to_node = graph.rank_to_node();
  for (std::uint32_t i = 0; i < rank_to_node.size(); ++i) {
    pimpl_->node_id_to_rank[rank_to_node[i]->id] = i;
  }

  // initialize secondary matrices
  switch (subtype_) {
    case AlignmentSubtype::kConvex:
      pimpl_->O[0] = 0;
      pimpl_->Q[0] = 0;
      for (std::uint32_t j = 1; j < matrix_width; ++j) {
        pimpl_->O[j] = kNegativeInfinity;
        pimpl_->Q[j] = q_ + (j - 1) * c_;
      }
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        const auto& edges = rank_to_node[i - 1]->inedges;
        std::int32_t penalty = edges.empty() ? q_ - c_ : kNegativeInfinity;
        for (const auto& it : edges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
          penalty = std::max(penalty, pimpl_->O[pred_i * matrix_width]);
        }
        pimpl_->O[i * matrix_width] = penalty + c_;
        pimpl_->Q[i * matrix_width] = kNegativeInfinity;
      }
      // fall through
    case AlignmentSubtype::kAffine:
      pimpl_->F[0] = 0;
      pimpl_->E[0] = 0;
      for (std::uint32_t j = 1; j < matrix_width; ++j) {
        pimpl_->F[j] = kNegativeInfinity;
        pimpl_->E[j] = g_ + (j - 1) * e_;
      }
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        const auto& edges = rank_to_node[i - 1]->inedges;
        std::int32_t penalty = edges.empty() ? g_ - e_ : kNegativeInfinity;
        for (const auto& it : edges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
          penalty = std::max(penalty, pimpl_->F[pred_i * matrix_width]);
        }
        pimpl_->F[i * matrix_width] = penalty + e_;
        pimpl_->E[i * matrix_width] = kNegativeInfinity;
      }
      // fall through
    case AlignmentSubtype::kLinear:
      pimpl_->H[0] = 0;
      break;
    default:
      break;
  }

  // initialize primary matrix
  switch (type_) {
    case AlignmentType::kSW:
      for (std::uint32_t j = 1; j < matrix_width; ++j) {
        pimpl_->H[j] = 0;
      }
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        pimpl_->H[i * matrix_width] = 0;
      }
      break;
    case AlignmentType::kNW:
      switch (subtype_) {
        case AlignmentSubtype::kConvex:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = std::max(pimpl_->Q[j], pimpl_->E[j]);
          }
          for (std::uint32_t i = 1; i < matrix_height; ++i) {
            pimpl_->H[i * matrix_width] = std::max(
                pimpl_->O[i * matrix_width],
                pimpl_->F[i * matrix_width]);
          }
          break;
        case AlignmentSubtype::kAffine:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = pimpl_->E[j];
          }
          for (std::uint32_t i = 1; i < matrix_height; ++i) {
            pimpl_->H[i * matrix_width] = pimpl_->F[i * matrix_width];
          }
          break;
        case AlignmentSubtype::kLinear:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = j * g_;
          }
          for (std::uint32_t i = 1; i < matrix_height; ++i) {
            const auto& edges = rank_to_node[i - 1]->inedges;
            std::int32_t penalty = edges.empty() ? 0 : kNegativeInfinity;
            for (const auto& it : edges) {
              std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
              penalty = std::max(penalty, pimpl_->H[pred_i * matrix_width]);
            }
            pimpl_->H[i * matrix_width] = penalty + g_;
          }
        default:
          break;
      }
      break;
    case AlignmentType::kOV:
      switch (subtype_) {
        case AlignmentSubtype::kConvex:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = std::max(pimpl_->Q[j], pimpl_->E[j]);
          }
          break;
        case AlignmentSubtype::kAffine:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = pimpl_->E[j];
          }
          break;
        case AlignmentSubtype::kLinear:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = j * g_;
          }
          break;
        default:
          break;
      }
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        pimpl_->H[i * matrix_width] = 0;
      }
      break;
    default:
      break;
  }
}